

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall CaDiCaL::Solver::trace_api_calls(Solver *this,FILE *file)

{
  char *__ptr;
  size_t sStack_20;
  
  require_solver_pointer_to_be_non_zero
            (this,"void CaDiCaL::Solver::trace_api_calls(FILE *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::trace_api_calls(FILE *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
  }
  else {
    if (this->internal != (Internal *)0x0) {
      if ((this->_state & VALID) == 0) {
        fatal_message_start();
        fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
                "void CaDiCaL::Solver::trace_api_calls(FILE *)",
                "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
               );
        __ptr = "solver in invalid state";
        sStack_20 = 0x17;
      }
      else if (file == (FILE *)0x0) {
        fatal_message_start();
        fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
                "void CaDiCaL::Solver::trace_api_calls(FILE *)",
                "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
               );
        __ptr = "invalid zero file argument";
        sStack_20 = 0x1a;
      }
      else if (tracing_api_calls_through_environment_variable_method == '\x01') {
        fatal_message_start();
        fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
                "void CaDiCaL::Solver::trace_api_calls(FILE *)",
                "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
               );
        __ptr = "already tracing API calls using environment variable \'CADICAL_API_TRACE\'";
        sStack_20 = 0x48;
      }
      else {
        if (this->trace_api_file == (FILE *)0x0) {
          this->trace_api_file = file;
          trace_api_call(this,"init");
          return;
        }
        fatal_message_start();
        fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
                "void CaDiCaL::Solver::trace_api_calls(FILE *)",
                "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
               );
        __ptr = "called twice";
        sStack_20 = 0xc;
      }
      goto LAB_00684246;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::trace_api_calls(FILE *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "internal solver not initialized";
  }
  sStack_20 = 0x1f;
LAB_00684246:
  fwrite(__ptr,sStack_20,1,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

void Solver::trace_api_calls (FILE *file) {
  LOG_API_CALL_BEGIN ("trace_api_calls");
  REQUIRE_VALID_STATE ();
  REQUIRE (file != 0, "invalid zero file argument");
  REQUIRE (!tracing_api_calls_through_environment_variable_method,
           "already tracing API calls "
           "using environment variable 'CADICAL_API_TRACE'");
  REQUIRE (!trace_api_file, "called twice");
  trace_api_file = file;
  LOG_API_CALL_END ("trace_api_calls");
  trace_api_call ("init");
}